

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa.c
# Opt level: O0

void soa_initFSA(soa_t *allocator,size_t blockSize,uchar numBlocks)

{
  soa_fsa_t *allocator_00;
  soa_fsa_t *ptr;
  uchar numBlocks_local;
  size_t blockSize_local;
  soa_t *allocator_local;
  
  if ((blockSize < 0x21) && (blockSize != 0)) {
    if ((allocator->fsa[blockSize - 1] == (soa_fsa_t *)0x0) &&
       (allocator_00 = (soa_fsa_t *)malloc(0x30), allocator_00 != (soa_fsa_t *)0x0)) {
      soa_fsa_init(allocator_00,blockSize,numBlocks);
      allocator->fsa[blockSize - 1] = allocator_00;
    }
    return;
  }
  __assert_fail("(blockSize<=SOA_SMALL_OBJECT_MAX_SIZE) && (blockSize>0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa.c"
                ,0x36,"void soa_initFSA(soa_t *, size_t, unsigned char)");
}

Assistant:

void soa_initFSA( soa_t *allocator, size_t blockSize, unsigned char numBlocks )
{
  assert((blockSize<=SOA_SMALL_OBJECT_MAX_SIZE) && (blockSize>0)) ;
  if(allocator->fsa[blockSize-1] == 0)
  {
    soa_fsa_t *ptr = (soa_fsa_t*) malloc(sizeof(soa_fsa_t));
    if(ptr!=0)
    {
      soa_fsa_init(ptr,blockSize,numBlocks);
      allocator->fsa[blockSize-1] = ptr;
    }    
  }
}